

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar.cpp
# Opt level: O1

void __thiscall QMenuBar::timerEvent(QMenuBar *this,QTimerEvent *e)

{
  QMenuBarPrivate *this_00;
  
  this_00 = *(QMenuBarPrivate **)&(this->super_QWidget).field_0x8;
  if (*(TimerId *)(e + 0x10) == (this_00->autoReleaseTimer).m_id) {
    QBasicTimer::stop();
    QMenuBarPrivate::setCurrentAction(this_00,(QAction *)0x0,false,false);
  }
  QObject::timerEvent((QTimerEvent *)this);
  return;
}

Assistant:

void QMenuBar::timerEvent (QTimerEvent *e)
{
    Q_D(QMenuBar);
    if (e->timerId() == d->autoReleaseTimer.timerId()) {
        d->autoReleaseTimer.stop();
        d->setCurrentAction(nullptr);
    }
    QWidget::timerEvent(e);
}